

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_setuid_setgid(void)

{
  __uid_t _Var1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  passwd *ppVar4;
  undefined8 uVar5;
  uv_process_options_t *puVar6;
  int *piVar7;
  uv_process_options_t *puVar8;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  undefined1 *nread;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *unaff_R14;
  uv_process_options_t *unaff_R15;
  undefined1 auVar9 [16];
  int64_t eval_b;
  int64_t eval_a;
  char gidstr [10];
  char uidstr [10];
  undefined1 auStack_960 [48];
  uv_handle_t *apuStack_930 [11];
  uv_loop_t *puStack_8d8;
  undefined8 auStack_770 [29];
  uv_stdio_container_t uStack_688;
  undefined4 uStack_678;
  undefined4 uStack_668;
  uv_process_options_t *puStack_650;
  long lStack_618;
  uint uStack_610;
  int iStack_60c;
  undefined1 auStack_608 [16];
  undefined8 uStack_5f8;
  undefined2 uStack_5f0;
  uv_stdio_container_t uStack_5e8;
  long alStack_5d0 [25];
  long alStack_508 [25];
  long alStack_440 [29];
  undefined1 auStack_358 [88];
  uint uStack_300;
  uv_process_options_t *puStack_198;
  uv_process_options_t *puStack_190;
  uv_process_options_t *puStack_188;
  long lStack_180;
  long lStack_178;
  uv_process_options_t *puStack_170;
  char cStack_159;
  long lStack_158;
  long lStack_150;
  uv_process_options_t *puStack_148;
  uv_process_options_t *puStack_140;
  uv_process_options_t *apuStack_138 [2];
  uv_process_options_t *puStack_128;
  cpu_set_t cStack_120;
  uv_process_options_t *puStack_98;
  char *pcStack_90;
  uv_process_options_t *puStack_88;
  uv_process_options_t *puStack_80;
  long lStack_78;
  long lStack_70;
  uv_process_options_t *puStack_68;
  long lStack_60;
  long lStack_58;
  uv_process_options_t *puStack_50;
  long local_48;
  long local_40;
  
  puStack_50 = (uv_process_options_t *)0x1c2129;
  _Var1 = getuid();
  if (_Var1 != 0) {
    puStack_50 = (uv_process_options_t *)0x1c22e8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  puStack_50 = (uv_process_options_t *)0x1c2144;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  puStack_50 = (uv_process_options_t *)0x1c2150;
  ppVar4 = getpwnam("nobody");
  if (ppVar4 == (passwd *)0x0) {
    puStack_50 = (uv_process_options_t *)0x1c22fb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22fb:
    puStack_50 = (uv_process_options_t *)0x1c2308;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c2308:
    puStack_50 = (uv_process_options_t *)0x1c2315;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c2315:
    puStack_50 = (uv_process_options_t *)0x1c2322;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c2322:
    puStack_50 = (uv_process_options_t *)0x1c232f;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar4->pw_uid;
    unaff_RBX = &options;
    options.gid = ppVar4->pw_gid;
    unaff_R15 = (uv_process_options_t *)0x1e6b28;
    unaff_R12 = &stack0xffffffffffffffd6;
    puStack_50 = (uv_process_options_t *)0x1c2198;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar4->pw_uid);
    unaff_R14 = (uv_process_options_t *)&stack0xffffffffffffffcc;
    puStack_50 = (uv_process_options_t *)0x1c21b3;
    snprintf((char *)unaff_R14,10,"%d",(ulong)ppVar4->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)unaff_R14;
    options.flags = 3;
    puStack_50 = (uv_process_options_t *)0x1c21d8;
    uVar5 = uv_default_loop();
    puStack_50 = (uv_process_options_t *)0x1c21ea;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 == -0xd) {
      puStack_50 = (uv_process_options_t *)0x1c22ef;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    local_40 = (long)iVar2;
    local_48 = 0;
    if (local_40 != 0) goto LAB_001c22fb;
    puStack_50 = (uv_process_options_t *)0x1c2216;
    uVar5 = uv_default_loop();
    puStack_50 = (uv_process_options_t *)0x1c2220;
    iVar2 = uv_run(uVar5,0);
    local_40 = (long)iVar2;
    local_48 = 0;
    if (local_40 != 0) goto LAB_001c2308;
    local_40 = 1;
    local_48 = (long)exit_cb_called;
    if (local_48 != 1) goto LAB_001c2315;
    local_40 = 1;
    local_48 = (long)close_cb_called;
    if (local_48 != 1) goto LAB_001c2322;
    puStack_50 = (uv_process_options_t *)0x1c2289;
    unaff_R14 = (uv_process_options_t *)uv_default_loop();
    unaff_RBX = (uv_process_options_t *)0x0;
    puStack_50 = (uv_process_options_t *)0x1c229f;
    uv_walk(unaff_R14,close_walk_cb,0);
    puStack_50 = (uv_process_options_t *)0x1c22a9;
    uv_run(unaff_R14,0);
    local_40 = 0;
    puStack_50 = (uv_process_options_t *)0x1c22b7;
    uVar5 = uv_default_loop();
    puStack_50 = (uv_process_options_t *)0x1c22bf;
    iVar2 = uv_loop_close(uVar5);
    local_48 = (long)iVar2;
    if (local_40 == local_48) {
      puStack_50 = (uv_process_options_t *)0x1c22d5;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_50 = (uv_process_options_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  puStack_68 = (uv_process_options_t *)0x1c2346;
  puStack_50 = unaff_RBX;
  _Var1 = getuid();
  if (_Var1 == 0) {
    puStack_68 = (uv_process_options_t *)0x1c2356;
    puVar6 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar6 == (uv_process_options_t *)0x0) goto LAB_001c24e5;
    puStack_68 = (uv_process_options_t *)0x1c236a;
    iVar2 = setgid(*(__gid_t *)((long)&puVar6->args + 4));
    lStack_58 = (long)iVar2;
    lStack_60 = 0;
    unaff_RBX = puVar6;
    if (lStack_58 != 0) goto LAB_001c24ea;
    puStack_68 = (uv_process_options_t *)0x1c2390;
    iVar2 = setuid(*(__uid_t *)&puVar6->args);
    lStack_58 = (long)iVar2;
    lStack_60 = 0;
    if (lStack_58 == 0) goto LAB_001c23ae;
  }
  else {
LAB_001c23ae:
    puStack_68 = (uv_process_options_t *)0x1c23c1;
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puStack_68 = (uv_process_options_t *)0x1c23de;
    uVar5 = uv_default_loop();
    puStack_68 = (uv_process_options_t *)0x1c23f0;
    iVar2 = uv_spawn(uVar5,&process,&options);
    lStack_58 = (long)iVar2;
    lStack_60 = -1;
    if (lStack_58 == -1) {
      puStack_68 = (uv_process_options_t *)0x1c2413;
      uVar5 = uv_default_loop();
      puStack_68 = (uv_process_options_t *)0x1c241d;
      iVar2 = uv_run(uVar5,0);
      lStack_58 = (long)iVar2;
      lStack_60 = 0;
      if (lStack_58 != 0) goto LAB_001c24be;
      lStack_58 = (long)close_cb_called;
      lStack_60 = 0;
      if (lStack_58 != 0) goto LAB_001c24cb;
      puStack_68 = (uv_process_options_t *)0x1c245f;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      puStack_68 = (uv_process_options_t *)0x1c2473;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_68 = (uv_process_options_t *)0x1c247d;
      uv_run(unaff_RBX,0);
      lStack_58 = 0;
      puStack_68 = (uv_process_options_t *)0x1c248b;
      uVar5 = uv_default_loop();
      puStack_68 = (uv_process_options_t *)0x1c2493;
      iVar2 = uv_loop_close(uVar5);
      lStack_60 = (long)iVar2;
      if (lStack_58 == lStack_60) {
        puStack_68 = (uv_process_options_t *)0x1c24a9;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_68 = (uv_process_options_t *)0x1c24be;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c24be:
      puStack_68 = (uv_process_options_t *)0x1c24cb;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c24cb:
      puStack_68 = (uv_process_options_t *)0x1c24d8;
      run_test_spawn_setuid_fails_cold_5();
    }
    puStack_68 = (uv_process_options_t *)0x1c24e5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24e5:
    puStack_68 = (uv_process_options_t *)0x1c24ea;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ea:
    puStack_68 = (uv_process_options_t *)0x1c24f7;
    run_test_spawn_setuid_fails_cold_1();
  }
  puStack_68 = (uv_process_options_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_80 = (uv_process_options_t *)0x1c250e;
  puStack_68 = unaff_RBX;
  _Var1 = getuid();
  if (_Var1 == 0) {
    puStack_80 = (uv_process_options_t *)0x1c251e;
    puVar6 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar6 == (uv_process_options_t *)0x0) goto LAB_001c26ad;
    puStack_80 = (uv_process_options_t *)0x1c2532;
    iVar2 = setgid(*(__gid_t *)((long)&puVar6->args + 4));
    lStack_70 = (long)iVar2;
    lStack_78 = 0;
    unaff_RBX = puVar6;
    if (lStack_70 != 0) goto LAB_001c26b2;
    puStack_80 = (uv_process_options_t *)0x1c2558;
    iVar2 = setuid(*(__uid_t *)&puVar6->args);
    lStack_70 = (long)iVar2;
    lStack_78 = 0;
    if (lStack_70 == 0) goto LAB_001c2576;
  }
  else {
LAB_001c2576:
    puStack_80 = (uv_process_options_t *)0x1c2589;
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_80 = (uv_process_options_t *)0x1c25a6;
    uVar5 = uv_default_loop();
    puStack_80 = (uv_process_options_t *)0x1c25b8;
    iVar2 = uv_spawn(uVar5,&process,&options);
    lStack_70 = (long)iVar2;
    lStack_78 = -1;
    if (lStack_70 == -1) {
      puStack_80 = (uv_process_options_t *)0x1c25db;
      uVar5 = uv_default_loop();
      puStack_80 = (uv_process_options_t *)0x1c25e5;
      iVar2 = uv_run(uVar5,0);
      lStack_70 = (long)iVar2;
      lStack_78 = 0;
      if (lStack_70 != 0) goto LAB_001c2686;
      lStack_70 = (long)close_cb_called;
      lStack_78 = 0;
      if (lStack_70 != 0) goto LAB_001c2693;
      puStack_80 = (uv_process_options_t *)0x1c2627;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      puStack_80 = (uv_process_options_t *)0x1c263b;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_80 = (uv_process_options_t *)0x1c2645;
      uv_run(unaff_RBX,0);
      lStack_70 = 0;
      puStack_80 = (uv_process_options_t *)0x1c2653;
      uVar5 = uv_default_loop();
      puStack_80 = (uv_process_options_t *)0x1c265b;
      iVar2 = uv_loop_close(uVar5);
      lStack_78 = (long)iVar2;
      if (lStack_70 == lStack_78) {
        puStack_80 = (uv_process_options_t *)0x1c2671;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_80 = (uv_process_options_t *)0x1c2686;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2686:
      puStack_80 = (uv_process_options_t *)0x1c2693;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2693:
      puStack_80 = (uv_process_options_t *)0x1c26a0;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_80 = (uv_process_options_t *)0x1c26ad;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c26ad:
    puStack_80 = (uv_process_options_t *)0x1c26b2;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c26b2:
    puStack_80 = (uv_process_options_t *)0x1c26bf;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_80 = (uv_process_options_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  puStack_148 = (uv_process_options_t *)0x1c26df;
  puStack_98 = unaff_RBX;
  pcStack_90 = unaff_R12;
  puStack_88 = unaff_R14;
  puStack_80 = unaff_R15;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    puStack_148 = (uv_process_options_t *)0x1c28c8;
    run_test_spawn_affinity_cold_1();
LAB_001c28c8:
    puStack_148 = (uv_process_options_t *)0x1c28d5;
    run_test_spawn_affinity_cold_2();
LAB_001c28d5:
    puStack_148 = (uv_process_options_t *)0x1c28e2;
    run_test_spawn_affinity_cold_3();
    puVar6 = unaff_RBX;
LAB_001c28e2:
    puVar8 = unaff_R14;
    puStack_148 = (uv_process_options_t *)0x1c28e7;
    run_test_spawn_affinity_cold_9();
LAB_001c28e7:
    puStack_148 = (uv_process_options_t *)0x1c28ec;
    run_test_spawn_affinity_cold_4();
LAB_001c28ec:
    puStack_148 = (uv_process_options_t *)0x1c28f1;
    run_test_spawn_affinity_cold_5();
LAB_001c28f1:
    puStack_148 = (uv_process_options_t *)0x1c28f6;
    run_test_spawn_affinity_cold_6();
LAB_001c28f6:
    puStack_148 = (uv_process_options_t *)0x1c28fb;
    run_test_spawn_affinity_cold_7();
  }
  else {
    unaff_RBX = (uv_process_options_t *)(ulong)uVar3;
    cStack_120.__bits[0xe] = 0;
    cStack_120.__bits[0xf] = 0;
    cStack_120.__bits[0xc] = 0;
    cStack_120.__bits[0xd] = 0;
    cStack_120.__bits[10] = 0;
    cStack_120.__bits[0xb] = 0;
    cStack_120.__bits[8] = 0;
    cStack_120.__bits[9] = 0;
    cStack_120.__bits[6] = 0;
    cStack_120.__bits[7] = 0;
    cStack_120.__bits[4] = 0;
    cStack_120.__bits[5] = 0;
    cStack_120.__bits[2] = 0;
    cStack_120.__bits[3] = 0;
    cStack_120.__bits[0] = 0;
    cStack_120.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    puStack_148 = (uv_process_options_t *)0x1c271f;
    iVar2 = sched_getaffinity(0,0x80,&cStack_120);
    if (iVar2 != 0) {
      puStack_148 = (uv_process_options_t *)0x1c2728;
      piVar7 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar7;
    }
    puStack_140 = (uv_process_options_t *)0x0;
    apuStack_138[0] = unaff_R14;
    if (unaff_R14 != (uv_process_options_t *)0x0) goto LAB_001c28c8;
    unaff_RBX = (uv_process_options_t *)(ulong)uVar3;
    puVar6 = (uv_process_options_t *)0x0;
    do {
      if ((puVar6 < (uv_process_options_t *)0x400) &&
         (puVar8 = puVar6,
         (cStack_120.__bits[(ulong)puVar6 >> 6] >> ((ulong)puVar6 & 0x3f) & 1) != 0)) break;
      puVar6 = (uv_process_options_t *)((long)&puVar6->exit_cb + 1);
      puVar8 = unaff_RBX;
    } while (unaff_RBX != puVar6);
    unaff_R15 = (uv_process_options_t *)((ulong)puVar8 & 0xffffffff);
    puStack_140 = unaff_RBX;
    apuStack_138[0] = unaff_R15;
    if (unaff_RBX <= unaff_R15) goto LAB_001c28d5;
    puStack_148 = (uv_process_options_t *)0x1c27a8;
    snprintf((char *)apuStack_138,0xb,"%d",unaff_R15);
    puStack_148 = (uv_process_options_t *)0x1c27bb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_148 = (uv_process_options_t *)0x1c27c8;
    puVar8 = (uv_process_options_t *)calloc((size_t)unaff_RBX,1);
    puVar6 = unaff_RBX;
    if (puVar8 == (uv_process_options_t *)0x0) goto LAB_001c28e2;
    *(char *)((long)&unaff_R15->exit_cb + (long)&puVar8->exit_cb) = '\x01';
    puVar6 = &options;
    options.cpumask = (char *)puVar8;
    options.cpumask_size = (size_t)unaff_RBX;
    options.args[2] = (char *)apuStack_138;
    options.args[3] = "dummy";
    puStack_148 = (uv_process_options_t *)0x1c2810;
    uVar5 = uv_default_loop();
    puStack_148 = (uv_process_options_t *)0x1c2822;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_001c28e7;
    puStack_148 = (uv_process_options_t *)0x1c282f;
    uVar5 = uv_default_loop();
    puStack_148 = (uv_process_options_t *)0x1c2839;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_001c28ec;
    if (exit_cb_called != 1) goto LAB_001c28f1;
    if (close_cb_called != 1) goto LAB_001c28f6;
    puStack_148 = (uv_process_options_t *)0x1c2863;
    free(puVar8);
    puStack_148 = (uv_process_options_t *)0x1c2868;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_148 = (uv_process_options_t *)0x1c287c;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_148 = (uv_process_options_t *)0x1c2886;
    uv_run(puVar6,0);
    puStack_140 = (uv_process_options_t *)0x0;
    puStack_148 = (uv_process_options_t *)0x1c2893;
    uVar5 = uv_default_loop();
    puStack_148 = (uv_process_options_t *)0x1c289b;
    iVar2 = uv_loop_close(uVar5);
    puStack_128 = (uv_process_options_t *)(long)iVar2;
    if (puStack_140 == puStack_128) {
      puStack_148 = (uv_process_options_t *)0x1c28b2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_148 = (uv_process_options_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_170 = (uv_process_options_t *)0x1c2912;
  puStack_148 = puVar6;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    puStack_170 = (uv_process_options_t *)0x1c29d1;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29d1:
    puStack_170 = (uv_process_options_t *)0x1c29d6;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29d6:
    puStack_170 = (uv_process_options_t *)0x1c29db;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_170 = (uv_process_options_t *)0x1c292d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_159;
    cStack_159 = '\0';
    options.cpumask_size = 0;
    puVar6 = &options;
    puStack_170 = (uv_process_options_t *)0x1c2953;
    uVar5 = uv_default_loop();
    puStack_170 = (uv_process_options_t *)0x1c2965;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != -0x16) goto LAB_001c29d1;
    if (exit_cb_called != 0) goto LAB_001c29d6;
    puStack_170 = (uv_process_options_t *)0x1c2978;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_170 = (uv_process_options_t *)0x1c298c;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_170 = (uv_process_options_t *)0x1c2996;
    uv_run(puVar6,0);
    lStack_150 = 0;
    puStack_170 = (uv_process_options_t *)0x1c29a4;
    uVar5 = uv_default_loop();
    puStack_170 = (uv_process_options_t *)0x1c29ac;
    iVar2 = uv_loop_close(uVar5);
    lStack_158 = (long)iVar2;
    if (lStack_150 == lStack_158) {
      puStack_170 = (uv_process_options_t *)0x1c29c4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_170 = (uv_process_options_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_188 = (uv_process_options_t *)0x1c29fd;
  puStack_170 = puVar6;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_188 = (uv_process_options_t *)0x1c2a02;
  uVar5 = uv_default_loop();
  puStack_188 = (uv_process_options_t *)0x1c2a18;
  iVar2 = uv_spawn(uVar5,&process,&options);
  lStack_178 = (long)iVar2;
  lStack_180 = 0;
  if (lStack_178 == 0) {
    puStack_188 = (uv_process_options_t *)0x1c2a3b;
    uVar5 = uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2a45;
    iVar2 = uv_run(uVar5,0);
    lStack_178 = (long)iVar2;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c2b56;
    puStack_188 = (uv_process_options_t *)0x1c2a6f;
    iVar2 = uv_is_closing(&process);
    lStack_178 = (long)iVar2;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c2b63;
    puStack_188 = (uv_process_options_t *)0x1c2a9b;
    uv_close(&process,0);
    puStack_188 = (uv_process_options_t *)0x1c2aa0;
    uVar5 = uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2aaa;
    iVar2 = uv_run(uVar5,0);
    lStack_178 = (long)iVar2;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c2b70;
    lStack_178 = 1;
    puStack_188 = (uv_process_options_t *)0x1c2add;
    iVar2 = uv_is_closing(&process);
    lStack_180 = (long)iVar2;
    if (lStack_178 != lStack_180) goto LAB_001c2b7d;
    puStack_188 = (uv_process_options_t *)0x1c2af7;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2b0b;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_188 = (uv_process_options_t *)0x1c2b15;
    uv_run(puVar6,0);
    lStack_178 = 0;
    puStack_188 = (uv_process_options_t *)0x1c2b23;
    uVar5 = uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2b2b;
    iVar2 = uv_loop_close(uVar5);
    lStack_180 = (long)iVar2;
    if (lStack_178 == lStack_180) {
      puStack_188 = (uv_process_options_t *)0x1c2b41;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_188 = (uv_process_options_t *)0x1c2b56;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b56:
    puStack_188 = (uv_process_options_t *)0x1c2b63;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b63:
    puStack_188 = (uv_process_options_t *)0x1c2b70;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b70:
    puStack_188 = (uv_process_options_t *)0x1c2b7d;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b7d:
    puStack_188 = (uv_process_options_t *)0x1c2b8a;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_188 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_5f8 = 0x6c756e2f7665642f;
  uStack_5f0 = 0x6c;
  puStack_198 = puVar6;
  puStack_190 = puVar8;
  puStack_188 = unaff_R15;
  iVar2 = uv_fs_open(0,auStack_358,&uStack_5f8,2,0,0);
  alStack_440[0] = (long)iVar2;
  alStack_508[0] = 0;
  if (alStack_440[0] == 0) {
    puVar6 = (uv_process_options_t *)(ulong)uStack_300;
    uStack_610 = uStack_300;
    init_process_options("spawn_helper8",exit_cb);
    uVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(uVar5,(uv_stream_t *)alStack_440,0);
    alStack_508[0] = (long)iVar2;
    alStack_5d0[0] = 0;
    if (alStack_508[0] != 0) goto LAB_001c2eb0;
    options.stdio = &uStack_5e8;
    uStack_5e8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_5e8.data.stream = (uv_stream_t *)alStack_440;
    iStack_60c = dup(uStack_300);
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    alStack_508[0] = (long)iVar2;
    alStack_5d0[0] = 0;
    if (alStack_508[0] != 0) goto LAB_001c2ec2;
    auStack_608 = uv_buf_init(&uStack_610,4);
    iVar2 = uv_write(alStack_508,alStack_440,auStack_608,1,write_null_cb);
    alStack_5d0[0] = (long)iVar2;
    if (alStack_5d0[0] != 0) goto LAB_001c2ed4;
    auVar9 = uv_buf_init(&iStack_60c,4);
    auStack_608 = auVar9;
    iVar2 = uv_write(alStack_5d0,alStack_440,auStack_608,1,write_cb);
    lStack_618 = 0;
    if (iVar2 != 0) goto LAB_001c2ee3;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    lStack_618 = 0;
    if (iVar2 != 0) goto LAB_001c2ef2;
    iVar2 = uv_fs_close(0,auStack_358,uStack_610,0);
    lStack_618 = 0;
    if (iVar2 != 0) goto LAB_001c2f01;
    lStack_618 = (long)exit_cb_called;
    if (lStack_618 != 1) goto LAB_001c2f10;
    lStack_618 = (long)close_cb_called;
    if (lStack_618 != 2) goto LAB_001c2f1f;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    uv_run(puVar6,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    lStack_618 = (long)iVar2;
    if (lStack_618 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2eb0:
    run_test_spawn_fs_open_cold_2();
LAB_001c2ec2:
    run_test_spawn_fs_open_cold_3();
LAB_001c2ed4:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ee3:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ef2:
    run_test_spawn_fs_open_cold_6();
LAB_001c2f01:
    run_test_spawn_fs_open_cold_7();
LAB_001c2f10:
    run_test_spawn_fs_open_cold_8();
LAB_001c2f1f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_618;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_650 = puVar6;
  auStack_960._24_16_ = uv_buf_init("",1);
  iVar2 = uv_pipe(auStack_960 + 0x10,0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_688;
    uStack_688.flags = UV_INHERIT_FD;
    uStack_688.data.file = auStack_960._16_4_;
    uStack_678 = 0;
    uStack_668 = 0;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    apuStack_930[0] = (uv_handle_t *)(long)iVar2;
    auStack_770[0] = 0;
    if (apuStack_930[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(uVar5,auStack_770,0);
    apuStack_930[0] = (uv_handle_t *)(long)iVar2;
    auStack_960._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_930[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar2 = uv_pipe_open(auStack_770,auStack_960._16_4_);
    apuStack_930[0] = (uv_handle_t *)(long)iVar2;
    auStack_960._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_930[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    auStack_960._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start(auStack_770,on_alloc,on_read_once);
    apuStack_930[0] = (uv_handle_t *)(long)iVar2;
    auStack_960._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_930[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    auStack_960._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write(0,apuStack_930,auStack_960._20_4_,auStack_960 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_960._8_8_ = SEXT48(iVar2);
    if (auStack_960._0_8_ != auStack_960._8_8_) goto LAB_001c342a;
    auStack_960._0_8_ = (uv_loop_t *)0x1;
    auStack_960._8_8_ = puStack_8d8;
    if (puStack_8d8 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(apuStack_930);
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,1);
    auStack_960._0_8_ = SEXT48(iVar2);
    auStack_960._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_960._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    auStack_960._0_8_ = (uv_loop_t *)0x1;
    auStack_960._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_960._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(auStack_770,close_cb);
    auStack_960._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write(0,apuStack_930,auStack_960._20_4_,auStack_960 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_960._8_8_ = SEXT48(iVar2);
    if (auStack_960._0_8_ != auStack_960._8_8_) goto LAB_001c3466;
    auStack_960._0_8_ = (uv_loop_t *)0x1;
    auStack_960._8_8_ = puStack_8d8;
    if (puStack_8d8 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(apuStack_930);
    uVar5 = uv_default_loop();
    iVar2 = uv_timer_init(uVar5,&timer);
    auStack_960._0_8_ = SEXT48(iVar2);
    auStack_960._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_960._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_960._0_8_ = SEXT48(iVar2);
    auStack_960._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_960._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,1);
    if (iVar2 == 1) {
      uVar5 = uv_default_loop();
      iVar2 = uv_run(uVar5,1);
      auStack_960._0_8_ = SEXT48(iVar2);
      auStack_960._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_960._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    auStack_960._0_8_ = (uv_loop_t *)0x1;
    auStack_960._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_960._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_960._0_8_ = SEXT48(iVar2);
    auStack_960._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_960._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar2 = close(auStack_960._20_4_);
    auStack_960._0_8_ = SEXT48(iVar2);
    auStack_960._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_960._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    auStack_960._20_4_ = -1;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    auStack_960._0_8_ = (uv_loop_t *)0x0;
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    auStack_960._8_8_ = SEXT48(iVar2);
    if (auStack_960._0_8_ == auStack_960._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)auStack_960;
  nread = auStack_960 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_setuid_setgid) {
  int r;
  struct passwd* pw;
  char uidstr[10];
  char gidstr[10];

  /* if not root, then this will fail. */
  uv_uid_t uid = getuid();
  if (uid != 0) {
    RETURN_SKIP("It should be run as root user");
  }

  init_process_options("spawn_helper_setuid_setgid", exit_cb);

  /* become the "nobody" user. */
  pw = getpwnam("nobody");
  ASSERT_NOT_NULL(pw);
  options.uid = pw->pw_uid;
  options.gid = pw->pw_gid;
  snprintf(uidstr, sizeof(uidstr), "%d", pw->pw_uid);
  snprintf(gidstr, sizeof(gidstr), "%d", pw->pw_gid);
  options.args[2] = uidstr;
  options.args[3] = gidstr;
  options.flags = UV_PROCESS_SETUID | UV_PROCESS_SETGID;

  r = uv_spawn(uv_default_loop(), &process, &options);
  if (r == UV_EACCES)
    RETURN_SKIP("user 'nobody' cannot access the test runner");

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}